

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  Gia_Obj_t *pObj;
  int Entry;
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar7;
  long lVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  int **ppiVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  Vec_Int_t *local_90;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < LimitMax * 2 - 1U) {
    iVar3 = LimitMax * 2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar3;
  lVar8 = (long)iVar3;
  if (iVar3 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 * 4);
  }
  vNodes->pArray = piVar6;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nSize = 0;
  __ptr->nCap = iVar3;
  if (iVar3 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 * 4);
  }
  __ptr->pArray = piVar6;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 << 2);
  }
  p_00->pArray = piVar6;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  local_90 = (Vec_Int_t *)calloc(1000,0x10);
  pVVar7->pArray = local_90;
  Gia_ManCreateRefs(p);
  uVar12 = 0;
  if (0 < p->nObjs) {
    uVar4 = 1000;
    uVar12 = 0;
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = p->pObjs + lVar8;
      if (((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) && (p->pRefs[lVar8] != 0))
      {
        vNodes->nSize = 0;
        iVar3 = Gia_ObjCheckMffc_rec(p,pObj,LimitMax,vNodes);
        if (iVar3 != 0) {
          __ptr->nSize = 0;
          p_00->nSize = 0;
          qsort(vNodes->pArray,(long)vNodes->nSize,4,Vec_IntSortCompare1);
          iVar5 = vNodes->nSize;
          if (0 < iVar5) {
            lVar14 = 0;
            do {
              Entry = vNodes->pArray[lVar14];
              if (p->pRefs[Entry] < 1) {
                if ((Entry < 0) || (p->nObjs <= Entry)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((~*(uint *)(p->pObjs + Entry) & 0x9fffffff) == 0) goto LAB_0079963a;
                uVar15 = (ulong)(uint)p_00->nSize;
                pVVar10 = p_00;
                if (uVar15 != 0) {
                  if (p_00->nSize < 1) goto LAB_00799a95;
                  piVar6 = p_00->pArray;
                  goto LAB_00799655;
                }
LAB_0079965b:
                Vec_IntPush(pVVar10,Entry);
                iVar5 = vNodes->nSize;
              }
              else {
LAB_0079963a:
                uVar15 = (ulong)(uint)__ptr->nSize;
                pVVar10 = __ptr;
                if (uVar15 == 0) goto LAB_0079965b;
                if (__ptr->nSize < 1) {
LAB_00799a95:
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
                }
                piVar6 = __ptr->pArray;
LAB_00799655:
                if (piVar6[uVar15 - 1] != Entry) goto LAB_0079965b;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar5);
          }
          pGVar1 = p->pObjs;
          if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
        }
        if (0 < vNodes->nSize) {
          piVar6 = vNodes->pArray;
          piVar2 = p->pRefs;
          lVar14 = 0;
          do {
            piVar2[piVar6[lVar14]] = piVar2[piVar6[lVar14]] + 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < vNodes->nSize);
        }
        if ((iVar3 != 0) && (iVar3 = p_00->nSize, LimitMin <= iVar3)) {
          uVar9 = __ptr->nSize;
          if ((int)uVar9 <= SuppMax) {
            if (uVar12 == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (local_90 == (Vec_Int_t *)0x0) {
                  local_90 = (Vec_Int_t *)malloc(0x100);
                }
                else {
                  local_90 = (Vec_Int_t *)realloc(local_90,0x100);
                }
                pVVar7->pArray = local_90;
                pVVar10 = local_90 + (int)uVar4;
                uVar13 = 0x10;
                uVar4 = 0x10 - uVar4;
              }
              else {
                uVar13 = uVar4 * 2;
                if (local_90 == (Vec_Int_t *)0x0) {
                  local_90 = (Vec_Int_t *)malloc((ulong)uVar13 << 4);
                }
                else {
                  local_90 = (Vec_Int_t *)realloc(local_90,(ulong)uVar13 << 4);
                }
                pVVar7->pArray = local_90;
                pVVar10 = local_90 + uVar4;
              }
              memset(pVVar10,0,(ulong)uVar4 << 4);
              pVVar7->nCap = uVar13;
              uVar4 = uVar13;
            }
            uVar13 = uVar12 + 1;
            pVVar7->nSize = uVar13;
            if ((int)uVar12 < 0) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            pVVar10 = local_90 + ((ulong)uVar13 - 1);
            iVar5 = uVar9 + iVar3 + 0x14;
            if (pVVar10->nCap < iVar5) {
              if (local_90[(ulong)uVar13 - 1].pArray == (int *)0x0) {
                piVar6 = (int *)malloc((long)iVar5 << 2);
              }
              else {
                piVar6 = (int *)realloc(local_90[(ulong)uVar13 - 1].pArray,(long)iVar5 << 2);
              }
              local_90[(ulong)uVar13 - 1].pArray = piVar6;
              if (piVar6 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar10->nCap = iVar5;
            }
            Vec_IntPush(pVVar10,(int)lVar8);
            Vec_IntPush(pVVar10,uVar9);
            Vec_IntPush(pVVar10,iVar3);
            if (0 < (int)uVar9) {
              piVar6 = __ptr->pArray;
              uVar15 = 0;
              do {
                Vec_IntPush(pVVar10,piVar6[uVar15]);
                uVar15 = uVar15 + 1;
              } while (uVar9 != uVar15);
            }
            Vec_IntPush(pVVar10,(iVar3 * 1000) / (int)uVar9);
            uVar12 = uVar13;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  qsort(local_90,(long)(int)uVar12,0x10,Vec_WecSortCompare6);
  if (0 < (int)uVar12) {
    lVar8 = 0;
    do {
      iVar3 = *(int *)((long)&local_90->nSize + lVar8);
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      *(int *)((long)&local_90->nSize + lVar8) = iVar3 + -1;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar12 << 4 != lVar8);
  }
  uVar4 = (int)(RatioBest * uVar12) / 100;
  if ((int)uVar4 < (int)uVar12) {
    ppiVar11 = &local_90[uVar4].pArray;
    uVar9 = uVar4;
    do {
      if ((int)(RatioBest * uVar12) < -99) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*ppiVar11 != (int *)0x0) {
        free(*ppiVar11);
        *ppiVar11 = (int *)0x0;
      }
      ((Vec_Int_t *)(ppiVar11 + -1))->nCap = 0;
      ((Vec_Int_t *)(ppiVar11 + -1))->nSize = 0;
      ppiVar11 = ppiVar11 + 2;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (int)uVar12);
    if ((int)uVar12 < (int)uVar4) {
LAB_00799b4f:
      __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                    ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
    }
    if ((int)uVar4 < (int)uVar12) {
      piVar6 = &local_90[uVar4].nSize;
      uVar9 = uVar4;
      do {
        if (*piVar6 < 0) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        *piVar6 = 0;
        uVar9 = uVar9 + 1;
        piVar6 = piVar6 + 4;
      } while ((int)uVar9 < (int)uVar12);
    }
  }
  else if ((int)uVar12 < (int)uVar4) goto LAB_00799b4f;
  pVVar7->nSize = uVar4;
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}